

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O3

ConditionalPredicateSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::ConditionalPredicateSyntax,slang::syntax::ConditionalPredicateSyntax_const&>
          (BumpAllocator *this,ConditionalPredicateSyntax *args)

{
  SyntaxNode *pSVar1;
  size_t sVar2;
  undefined4 uVar3;
  ConditionalPredicateSyntax *pCVar4;
  
  pCVar4 = (ConditionalPredicateSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((ConditionalPredicateSyntax *)this->endPtr < pCVar4 + 1) {
    pCVar4 = (ConditionalPredicateSyntax *)allocateSlow(this,0x50,8);
  }
  else {
    this->head->current = (byte *)(pCVar4 + 1);
  }
  (pCVar4->super_SyntaxNode).previewNode = (args->super_SyntaxNode).previewNode;
  uVar3 = *(undefined4 *)&(args->super_SyntaxNode).field_0x4;
  pSVar1 = (args->super_SyntaxNode).parent;
  (pCVar4->super_SyntaxNode).kind = (args->super_SyntaxNode).kind;
  *(undefined4 *)&(pCVar4->super_SyntaxNode).field_0x4 = uVar3;
  (pCVar4->super_SyntaxNode).parent = pSVar1;
  uVar3 = *(undefined4 *)&(args->conditions).super_SyntaxListBase.super_SyntaxNode.field_0x4;
  pSVar1 = (args->conditions).super_SyntaxListBase.super_SyntaxNode.parent;
  (pCVar4->conditions).super_SyntaxListBase.super_SyntaxNode.kind =
       (args->conditions).super_SyntaxListBase.super_SyntaxNode.kind;
  *(undefined4 *)&(pCVar4->conditions).super_SyntaxListBase.super_SyntaxNode.field_0x4 = uVar3;
  (pCVar4->conditions).super_SyntaxListBase.super_SyntaxNode.parent = pSVar1;
  (pCVar4->conditions).super_SyntaxListBase.super_SyntaxNode.previewNode =
       (args->conditions).super_SyntaxListBase.super_SyntaxNode.previewNode;
  (pCVar4->conditions).super_SyntaxListBase.childCount =
       (args->conditions).super_SyntaxListBase.childCount;
  (pCVar4->conditions).super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR_getChild_002f7cc8;
  sVar2 = (args->conditions).elements._M_extent._M_extent_value;
  (pCVar4->conditions).elements._M_ptr = (args->conditions).elements._M_ptr;
  (pCVar4->conditions).elements._M_extent._M_extent_value = sVar2;
  return pCVar4;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }